

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O1

size_t Downloader_libcurl::fetchDownloadedData(char *ptr,size_t size,size_t nmemb,void *stream)

{
  int iVar1;
  void *pvVar2;
  size_t __n;
  
  if (*(long *)((long)stream + 8) == 0) {
    pvVar2 = malloc((long)*(int *)((long)stream + 4));
    *(void **)((long)stream + 8) = pvVar2;
  }
  if (*(long *)((long)stream + 8) == 0) {
    __n = 0xffffffffffffffff;
  }
  else {
    __n = nmemb * size;
    while( true ) {
      if (__n + (long)*stream <= (ulong)(long)*(int *)((long)stream + 4)) break;
      iVar1 = *(int *)((long)stream + 4) * 2;
      *(int *)((long)stream + 4) = iVar1;
      pvVar2 = realloc(*(void **)((long)stream + 8),(long)iVar1);
      *(void **)((long)stream + 8) = pvVar2;
    }
    memcpy((void *)((long)*stream + *(long *)((long)stream + 8)),ptr,__n);
    *(int *)stream = *stream + (int)__n;
  }
  return __n;
}

Assistant:

size_t Downloader_libcurl::fetchDownloadedData(char *ptr, size_t size, size_t nmemb, void *stream)
{
    auto *mem = (memBlockStruc *)stream;

    if(mem->memBlock == nullptr) mem->memBlock = (char *)malloc(mem->allocSize);
    if(mem->memBlock == nullptr) return -1;
    while(mem->realSize + size * nmemb > mem->allocSize)
    {
        mem->allocSize <<= 1;
        mem->memBlock = (char *)realloc(mem->memBlock, mem->allocSize);
    }

    memcpy(&(mem->memBlock[mem->realSize]), ptr, size * nmemb);
    mem->realSize += size * nmemb;
    return size * nmemb;
}